

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CIfStm *stm)

{
  TypeInfo *left;
  IExpression *pIVar1;
  IStatement *pIVar2;
  bool bVar3;
  TypeInfo *in_RCX;
  string *this_00;
  undefined1 auStack_78 [8];
  string local_70;
  string errorMessage;
  
  this_00 = (string *)auStack_78;
  std::operator<<((ostream *)&std::cout,"typechecker: CIfStm\n");
  pIVar1 = (stm->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (((pIVar1 == (IExpression *)0x0) ||
      ((stm->positiveStatement)._M_t.
       super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
       super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
       super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) ||
     ((stm->negativeStatement)._M_t.
      super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
      super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
      super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) {
    CError::CError((CError *)auStack_78,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)auStack_78);
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    left = &this->lastCalculatedType;
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
    bVar3 = operator==(left,(TypeInfo *)auStack_78);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    if (bVar3) {
      return;
    }
    if ((this->lastCalculatedType).type == BOOLEAN) {
      pIVar2 = (stm->positiveStatement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
      pIVar2 = (stm->negativeStatement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,VOID);
      TypeInfo::operator=(left,(TypeInfo *)auStack_78);
      this_00 = (string *)(auStack_78 + 8);
    }
    else {
      TypeInfo::TypeInfo((TypeInfo *)auStack_78,BOOLEAN);
      CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)auStack_78,left,in_RCX);
      std::__cxx11::string::~string((string *)(auStack_78 + 8));
      CError::CError((CError *)auStack_78,&errorMessage,
                     &(((stm->conditionExpression)._M_t.
                        super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                        super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                        super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                      super_PositionedNode).position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)auStack_78);
      std::__cxx11::string::~string((string *)auStack_78);
      this_00 = &errorMessage;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CIfStm &stm )
{
    std::cout << "typechecker: CIfStm\n";

    if( stm.conditionExpression && stm.positiveStatement && stm.negativeStatement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::BOOLEAN, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.conditionExpression->position ) );
            return;
		}
        stm.positiveStatement->Accept( *this );
        stm.negativeStatement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}